

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_183::InfoCollector::isRelevant(InfoCollector *this,Type type)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  bool bVar2;
  Type *pTVar3;
  Type TVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Type local_48;
  Type type_local;
  Iterator __begin3;
  
  if (((InfoCollector *)0x1 < this) && (((ulong)this & 1) != 0 && (InfoCollector *)0x6 < this)) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48.id = (uintptr_t)this;
    type_local.id = (uintptr_t)&local_48;
    PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            wasm::Type::end(&local_48);
    TVar4.id = (uintptr_t)&local_48;
    for (; PVar1.index = (size_t)__begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent, PVar1.parent = (Type *)TVar4.id, PVar5 != PVar1;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1)) {
      pTVar3 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
      bVar2 = isRelevant((InfoCollector *)pTVar3->id,type);
      if (bVar2) break;
      TVar4 = type_local;
    }
  }
  return (InfoCollector *)0x1 < this;
}

Assistant:

bool isRelevant(Type type) {
    if (type == Type::unreachable || type == Type::none) {
      return false;
    }
    if (type.isTuple()) {
      for (auto t : type) {
        if (isRelevant(t)) {
          return true;
        }
      }
    }
    return true;
  }